

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O1

void __thiscall
Js::PropertyRecord::PropertyRecord
          (PropertyRecord *this,WCHAR *buffer,int length,DWORD bytelength,bool isSymbol)

{
  char16 cVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  undefined8 in_RAX;
  undefined4 *puVar6;
  uint uVar7;
  ulong uVar8;
  uint32 local_34 [2];
  uint32 numericValue;
  
  local_34[0] = (uint32)((ulong)in_RAX >> 0x20);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014f0a80;
  this->pid = -1;
  this->isSymbol = isSymbol;
  this->byteCount = bytelength;
  if (buffer == (WCHAR *)0x0 || length < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                                ,0x1b,"(length >= 0 && buffer != nullptr)",
                                "length >= 0 && buffer != nullptr");
    if (!bVar3) goto LAB_0078dd9d;
    *puVar6 = 0;
  }
  bVar3 = (!isSymbol && length < 0xb) && 0 < length;
  this->isNumeric = bVar3;
  this->hash = 0x811c9dc5;
  if (0 < length) {
    uVar7 = 0x811c9dc5;
    uVar8 = 0;
    do {
      cVar1 = buffer[uVar8];
      if ((bVar3) && ((ushort)(cVar1 + L'ￆ') < 0xfff6)) {
        this->isNumeric = false;
        bVar3 = false;
      }
      uVar7 = (uVar7 ^ (ushort)cVar1) * 0x1000193;
      *(char16 *)
       ((long)&this[1].super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject + uVar8 * 2) = cVar1;
      uVar8 = uVar8 + 1;
    } while ((uint)length != uVar8);
    this->hash = uVar7;
  }
  *(undefined2 *)
   ((long)&this[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
   + (long)length * 2) = 0;
  if (this->isNumeric != false) {
    BVar4 = JavascriptOperators::TryConvertToUInt32
                      ((char16 *)(this + 1),this->byteCount >> 1,local_34);
    this->isNumeric = local_34[0] != 0xffffffff && BVar4 != 0;
    if (local_34[0] != 0xffffffff && BVar4 != 0) {
      *(uint32 *)
       ((long)&this[1].super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject + (ulong)(this->byteCount & 0xfffffffe) + 2) =
           local_34[0];
      uVar5 = GetNumericValue(this);
      if (uVar5 != local_34[0]) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                                    ,0x36,"(GetNumericValue() == numericValue)",
                                    "GetNumericValue() == numericValue");
        if (!bVar3) {
LAB_0078dd9d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
  }
  return;
}

Assistant:

PropertyRecord::PropertyRecord(const WCHAR* buffer, const int length, DWORD bytelength, bool isSymbol)
        : pid(Js::Constants::NoProperty), isSymbol(isSymbol), byteCount(bytelength)
    {
        Assert(length >= 0 && buffer != nullptr);

        WCHAR* target = (WCHAR*)((PropertyRecord*)this + 1);
        isNumeric = (isSymbol || length > 10 || length <= 0) ? false : true;
        hash = CC_HASH_OFFSET_VALUE;

        for (int i = 0; i < length; i++)
        {
            const WCHAR byte = buffer[i];
            if (isNumeric)
            {
                if (byte < _u('0') || byte > _u('9'))
                  isNumeric = false;
            }

            CC_HASH_LOGIC(hash, byte);
            target[i] = byte;
        }
        target[length] = WCHAR(0);

        if (isNumeric)
        {
            uint32 numericValue;
            isNumeric = Js::PropertyRecord::IsPropertyNameNumeric(this->GetBuffer(), this->GetLength(), &numericValue);
            if (isNumeric)
            {
                *(uint32 *)(this->GetBuffer() + this->GetLength() + 1) = numericValue;
                Assert(GetNumericValue() == numericValue);
            }
        }
    }